

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageLevel.cpp
# Opt level: O3

void __thiscall Imf_3_2::DeepImageLevel::shiftPixels(DeepImageLevel *this,int dx,int dy)

{
  _Rb_tree_node_base *p_Var1;
  
  ImageLevel::shiftPixels(&this->super_ImageLevel,dx,dy);
  SampleCountChannel::resetBasePointer(&this->_sampleCounts);
  for (p_Var1 = (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_channels)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 2) + 0x48))();
  }
  return;
}

Assistant:

void
DeepImageLevel::shiftPixels (int dx, int dy)
{
    ImageLevel::shiftPixels (dx, dy);

    _sampleCounts.resetBasePointer ();

    for (ChannelMap::iterator i = _channels.begin (); i != _channels.end ();
         ++i)
        i->second->resetBasePointer ();
}